

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional_suite.cpp
# Opt level: O0

void to_suite::convert_boolean(void)

{
  bool bVar1;
  bool local_5d [19];
  type local_4a;
  undefined1 local_48 [6];
  optional<bool> result;
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_48,true);
  local_4a = (type)trial::dynamic::convert::
                   into<boost::optional<bool>,trial::dynamic::basic_variable<std::allocator<char>>>
                             ((basic_variable<std::allocator<char>_> *)local_48);
  bVar1 = boost::optional<bool>::operator!((optional<bool> *)&local_4a);
  boost::detail::test_impl
            ("result",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/optional_suite.cpp"
             ,0xc2,"void to_suite::convert_boolean()",!bVar1);
  local_5d[0] = true;
  bVar1 = boost::operator==((optional<bool> *)&local_4a,local_5d);
  boost::detail::test_impl
            ("result == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/optional_suite.cpp"
             ,0xc3,"void to_suite::convert_boolean()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  return;
}

Assistant:

void convert_boolean()
{
    variable data = true;
    auto result = convert::into<boost::optional<bool>>(data);
    TRIAL_PROTOCOL_TEST(result);
    TRIAL_PROTOCOL_TEST(result == true);
}